

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O0

bool CoreML::Specification::operator==(WordTagger *a,WordTagger *b)

{
  bool bVar1;
  uint32 uVar2;
  uint32 uVar3;
  TagsCase TVar4;
  TagsCase TVar5;
  int iVar6;
  string *psVar7;
  string *psVar8;
  StringVector *a_00;
  StringVector *b_00;
  long lVar9;
  long lVar10;
  size_t __n;
  void *__s1;
  void *__s2;
  size_t s;
  WordTagger *b_local;
  WordTagger *a_local;
  
  uVar2 = CoreMLModels::WordTagger::revision(a);
  uVar3 = CoreMLModels::WordTagger::revision(b);
  if (uVar2 == uVar3) {
    psVar7 = CoreMLModels::WordTagger::language_abi_cxx11_(a);
    psVar8 = CoreMLModels::WordTagger::language_abi_cxx11_(b);
    bVar1 = std::operator!=(psVar7,psVar8);
    if (bVar1) {
      a_local._7_1_ = false;
    }
    else {
      psVar7 = CoreMLModels::WordTagger::tokensoutputfeaturename_abi_cxx11_(a);
      psVar8 = CoreMLModels::WordTagger::tokensoutputfeaturename_abi_cxx11_(b);
      bVar1 = std::operator!=(psVar7,psVar8);
      if (bVar1) {
        a_local._7_1_ = false;
      }
      else {
        psVar7 = CoreMLModels::WordTagger::tokentagsoutputfeaturename_abi_cxx11_(a);
        psVar8 = CoreMLModels::WordTagger::tokentagsoutputfeaturename_abi_cxx11_(b);
        bVar1 = std::operator!=(psVar7,psVar8);
        if (bVar1) {
          a_local._7_1_ = false;
        }
        else {
          psVar7 = CoreMLModels::WordTagger::tokenlocationsoutputfeaturename_abi_cxx11_(a);
          psVar8 = CoreMLModels::WordTagger::tokenlocationsoutputfeaturename_abi_cxx11_(b);
          bVar1 = std::operator!=(psVar7,psVar8);
          if (bVar1) {
            a_local._7_1_ = false;
          }
          else {
            psVar7 = CoreMLModels::WordTagger::tokenlengthsoutputfeaturename_abi_cxx11_(a);
            psVar8 = CoreMLModels::WordTagger::tokenlengthsoutputfeaturename_abi_cxx11_(b);
            bVar1 = std::operator!=(psVar7,psVar8);
            if (bVar1) {
              a_local._7_1_ = false;
            }
            else {
              TVar4 = CoreMLModels::WordTagger::Tags_case(a);
              TVar5 = CoreMLModels::WordTagger::Tags_case(b);
              if (TVar4 == TVar5) {
                TVar4 = CoreMLModels::WordTagger::Tags_case(a);
                if ((TVar4 != TAGS_NOT_SET) && (TVar4 == kStringTags)) {
                  a_00 = CoreMLModels::WordTagger::stringtags(a);
                  b_00 = CoreMLModels::WordTagger::stringtags(b);
                  bVar1 = operator!=(a_00,b_00);
                  if (bVar1) {
                    return false;
                  }
                }
                CoreMLModels::WordTagger::modelparameterdata_abi_cxx11_(a);
                lVar9 = std::__cxx11::string::size();
                CoreMLModels::WordTagger::modelparameterdata_abi_cxx11_(b);
                lVar10 = std::__cxx11::string::size();
                if (lVar9 == lVar10) {
                  CoreMLModels::WordTagger::modelparameterdata_abi_cxx11_(a);
                  __n = std::__cxx11::string::size();
                  if (__n != 0) {
                    psVar7 = CoreMLModels::WordTagger::modelparameterdata_abi_cxx11_(a);
                    __s1 = (void *)std::__cxx11::string::operator[]((ulong)psVar7);
                    psVar7 = CoreMLModels::WordTagger::modelparameterdata_abi_cxx11_(b);
                    __s2 = (void *)std::__cxx11::string::operator[]((ulong)psVar7);
                    iVar6 = memcmp(__s1,__s2,__n);
                    if (iVar6 != 0) {
                      return false;
                    }
                  }
                  a_local._7_1_ = true;
                }
                else {
                  a_local._7_1_ = false;
                }
              }
              else {
                a_local._7_1_ = false;
              }
            }
          }
        }
      }
    }
  }
  else {
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool operator==(const CoreMLModels::WordTagger& a,
                        const CoreMLModels::WordTagger& b) {
            
            if (a.revision()!= b.revision()) {
                return false;
            }
            
            if (a.language()!= b.language()) {
                return false;
            }
            
            if (a.tokensoutputfeaturename() != b.tokensoutputfeaturename()) {
                return false;
            }
            
            if (a.tokentagsoutputfeaturename() != b.tokentagsoutputfeaturename()) {
                return false;
            }
            
            if (a.tokenlocationsoutputfeaturename() != b.tokenlocationsoutputfeaturename()) {
                return false;
            }
            
            if (a.tokenlengthsoutputfeaturename() != b.tokenlengthsoutputfeaturename()) {
                return false;
            }
            
            if (a.Tags_case()!= b.Tags_case()) {
                return false;
            }
            
            switch (a.Tags_case()) {
                case CoreMLModels::WordTagger::kStringTags:
                    if (a.stringtags() != b.stringtags()) {
                        return false;
                    }
                    break;
                case CoreMLModels::WordTagger::TAGS_NOT_SET:
                    break;
            }
            
            if (a.modelparameterdata().size() != b.modelparameterdata().size()) {
                return false;
            }
            
            size_t s = a.modelparameterdata().size();
            if (s > 0) {
                if (memcmp(&a.modelparameterdata()[0], &b.modelparameterdata()[0], s)) {
                    return false;
                }
            }
                
            return true;
        }